

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fComputeShaderBuiltinVarTests.cpp
# Opt level: O2

deUint32 __thiscall
deqp::gles31::Functional::ComputeBuiltinVarCase::getProgram
          (ComputeBuiltinVarCase *this,UVec3 *localSize)

{
  DataType dataType;
  RenderContext *renderCtx;
  iterator iVar1;
  ShaderProgram *this_00;
  ostream *poVar2;
  char *pcVar3;
  ProgramSources *sources;
  mapped_type *this_01;
  TestError *this_02;
  deUint32 dVar4;
  ShaderProgramSp program;
  string local_2c0;
  undefined1 local_2a0 [40];
  ProgramSources local_278;
  ostream local_1a8;
  
  iVar1 = std::
          _Rb_tree<tcu::Vector<unsigned_int,_3>,_std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>,_std::_Select1st<std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>_>,_deqp::gles31::Functional::LexicalCompareVec<unsigned_int,_3>,_std::allocator<std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>_>_>
          ::find(&(this->m_progMap)._M_t,localSize);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->m_progMap)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = (ShaderProgram *)operator_new(0xd0);
    renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
    memset(&local_278,0,0xac);
    local_278.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_278.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_278.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    local_278.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_278._193_8_ = 0;
    dataType = this->m_varType;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    poVar2 = std::operator<<(&local_1a8,"#version 310 es\n");
    poVar2 = std::operator<<(poVar2,"layout (local_size_x = ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,", local_size_y = ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,", local_size_z = ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,") in;\n");
    poVar2 = std::operator<<(poVar2,"uniform highp uvec2 u_stride;\n");
    poVar2 = std::operator<<(poVar2,"layout(binding = 0) buffer Output\n");
    poVar2 = std::operator<<(poVar2,"{\n");
    poVar2 = std::operator<<(poVar2,"\t");
    pcVar3 = glu::getDataTypeName(dataType);
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2," result[];\n");
    poVar2 = std::operator<<(poVar2,"} sb_out;\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"void main (void)\n");
    poVar2 = std::operator<<(poVar2,"{\n");
    poVar2 = std::operator<<(poVar2,
                             "\thighp uint offset = u_stride.x*gl_GlobalInvocationID.z + u_stride.y*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
                            );
    poVar2 = std::operator<<(poVar2,"\tsb_out.result[offset] = ");
    poVar2 = std::operator<<(poVar2,(string *)&this->m_varName);
    poVar2 = std::operator<<(poVar2,";\n");
    std::operator<<(poVar2,"}\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    glu::ComputeSource::ComputeSource((ComputeSource *)local_2a0,&local_2c0);
    sources = glu::ProgramSources::operator<<(&local_278,(ShaderSource *)local_2a0);
    glu::ShaderProgram::ShaderProgram(this_00,renderCtx,sources);
    de::SharedPtr<glu::ShaderProgram>::SharedPtr(&program,this_00);
    std::__cxx11::string::~string((string *)(local_2a0 + 8));
    std::__cxx11::string::~string((string *)&local_2c0);
    glu::ProgramSources::~ProgramSources(&local_278);
    glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                    program.m_ptr);
    if (((program.m_ptr)->m_program).m_info.linkOk == false) {
      this_02 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,"Compile failed",(allocator<char> *)&local_278);
      tcu::TestError::TestError(this_02,(string *)&local_1a8);
      __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    this_01 = std::
              map<tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>,_deqp::gles31::Functional::LexicalCompareVec<unsigned_int,_3>,_std::allocator<std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>_>_>
              ::operator[](&this->m_progMap,localSize);
    de::SharedPtr<glu::ShaderProgram>::operator=(this_01,&program);
    dVar4 = ((program.m_ptr)->m_program).m_program;
    de::SharedPtr<glu::ShaderProgram>::~SharedPtr(&program);
  }
  else {
    dVar4 = *(deUint32 *)&iVar1._M_node[1]._M_left[4]._M_right;
  }
  return dVar4;
}

Assistant:

deUint32 ComputeBuiltinVarCase::getProgram (const UVec3& localSize)
{
	LocalSizeProgramMap::const_iterator cachePos = m_progMap.find(localSize);
	if (cachePos != m_progMap.end())
		return cachePos->second->getProgram();
	else
	{
		ShaderProgramSp program(new ShaderProgram(m_context.getRenderContext(),
												  ProgramSources() << ComputeSource(genBuiltinVarSource(m_varName, m_varType, localSize))));

		// Log all compiled programs.
		m_testCtx.getLog() << *program;
		if (!program->isOk())
			throw tcu::TestError("Compile failed");

		m_progMap[localSize] = program;
		return program->getProgram();
	}
}